

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

ALLEGRO_PATH * al_clone_path(ALLEGRO_PATH *path)

{
  ALLEGRO_PATH *path_00;
  ALLEGRO_PATH *pAVar1;
  undefined8 *puVar2;
  ALLEGRO_USTR *pAVar3;
  long in_RDI;
  ALLEGRO_USTR **slot;
  uint i;
  ALLEGRO_PATH *clone;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  ALLEGRO_USTR *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  undefined4 local_1c;
  undefined8 local_8;
  
  local_8 = al_create_path(in_stack_ffffffffffffffd8);
  if (local_8 == (ALLEGRO_PATH *)0x0) {
    local_8 = (ALLEGRO_PATH *)0x0;
  }
  else {
    al_ustr_assign(in_stack_ffffffffffffffd0,
                   (ALLEGRO_USTR *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    al_ustr_assign(in_stack_ffffffffffffffd0,
                   (ALLEGRO_USTR *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    local_1c = 0;
    while( true ) {
      path_00 = (ALLEGRO_PATH *)(ulong)local_1c;
      pAVar1 = (ALLEGRO_PATH *)_al_vector_size((_AL_VECTOR *)(in_RDI + 0x10));
      if (pAVar1 <= path_00) break;
      puVar2 = (undefined8 *)
               _al_vector_alloc_back
                         ((_AL_VECTOR *)
                          CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      get_segment(path_00,in_stack_ffffffffffffffcc);
      pAVar3 = al_ustr_dup((ALLEGRO_USTR *)0x17c40e);
      *puVar2 = pAVar3;
      local_1c = local_1c + 1;
    }
  }
  return local_8;
}

Assistant:

ALLEGRO_PATH *al_clone_path(const ALLEGRO_PATH *path)
{
   ALLEGRO_PATH *clone;
   unsigned int i;

   ASSERT(path);

   clone = al_create_path(NULL);
   if (!clone) {
      return NULL;
   }

   al_ustr_assign(clone->drive, path->drive);
   al_ustr_assign(clone->filename, path->filename);

   for (i = 0; i < _al_vector_size(&path->segments); i++) {
      ALLEGRO_USTR **slot = _al_vector_alloc_back(&clone->segments);
      (*slot) = al_ustr_dup(get_segment(path, i));
   }

   return clone;
}